

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::AboveMaximum(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
               *this,uint64_t actual,SValue *expected,bool exclusive)

{
  int iVar1;
  undefined7 in_register_00000009;
  code *exclusive_00;
  Data local_18;
  
  iVar1 = (int)CONCAT71(in_register_00000009,exclusive);
  local_18.s.str =
       (Ch *)((ulong)(ushort)((ushort)((actual & 0xffffffff80000000) == 0) * 0x20 +
                              ((ushort)(actual >> 0x20 == 0) << 6 | (ushort)(-1 < (long)actual) << 7
                              ) + 0x116) << 0x30);
  if (iVar1 == 0) {
    exclusive_00 = (_func_ValueType_ptr *)0x0;
  }
  else {
    exclusive_00 = internal::
                   Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
                   ::GetExclusiveMaximumString;
  }
  local_18.n = (Number)actual;
  AddNumberError(this,iVar1 + kValidateErrorMaximum,(ValueType *)&local_18.s,expected,exclusive_00);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_18.s);
  return;
}

Assistant:

void AboveMaximum(uint64_t actual, const SValue& expected, bool exclusive) {
        AddNumberError(exclusive ? kValidateErrorExclusiveMaximum : kValidateErrorMaximum, ValueType(actual).Move(), expected,
            exclusive ? &SchemaType::GetExclusiveMaximumString : 0);
    }